

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_spawn.cpp
# Opt level: O3

void show_help(void)

{
  undefined8 in_RAX;
  undefined8 extraout_RDX;
  
  puts("bench_spawn [-h] [-q limit] [-t nthreads] [-T ntest] [problemsize]");
  puts("-h          Display help and exit");
  puts("-q limit    # of pending ready tasks that makes a spawning thread steal one");
  puts("-t nthreads Run with nthreads threads. Default is automatic (-1)");
  printf("-T ntest    Run test ntest in [1, %u]\n",9);
  puts("            Can be used multiple times to select several tests");
  puts("            By default all the tests are run\n");
  printf("problemsize defaults to %d\n",400000,extraout_RDX,in_RAX);
  return;
}

Assistant:

void show_help()
{
  puts("bench_spawn [-h] [-q limit] [-t nthreads] [-T ntest] [problemsize]");
  puts("-h          Display help and exit");
  puts("-q limit    # of pending ready tasks that makes a spawning thread steal one");
  puts("-t nthreads Run with nthreads threads. Default is automatic (-1)");
  printf("-T ntest    Run test ntest in [1, %u]\n", NTESTS);
  puts("            Can be used multiple times to select several tests");
  puts("            By default all the tests are run\n");
  printf("problemsize defaults to %d\n", N);
}